

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

optional<pbrt::BSDFSample> * __thiscall
pbrt::MeasuredBxDF::Sample_f
          (optional<pbrt::BSDFSample> *__return_storage_ptr__,MeasuredBxDF *this,Vector3f wo,
          Float uc,Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar17 [64];
  undefined1 auVar14 [16];
  undefined1 auVar22 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined8 in_XMM3_Qb;
  undefined1 auVar26 [16];
  PLSample PVar27;
  PLSample PVar28;
  Float params_fr [3];
  Float params [2];
  Vector2f local_e8;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_70;
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar25._4_60_ = wo._12_60_;
  auVar25._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._8_56_ = wo._8_56_;
  auVar17._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14 = auVar17._0_16_;
  if ((sampleFlags & Reflection) != Unset) {
    local_88._8_8_ = in_XMM3_Qb;
    local_88._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
    auVar9._0_8_ = CONCAT44(wo._12_4_,auVar25._0_4_) ^ 0x8000000080000000;
    auVar9._8_4_ = wo._16_4_ ^ 0x80000000;
    auVar9._12_4_ = wo._20_4_ ^ 0x80000000;
    if (auVar25._0_4_ <= -auVar25._0_4_) {
      auVar14._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
      auVar14._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
      auVar14._12_4_ = wo._12_4_ ^ 0x80000000;
    }
    local_58 = auVar25._0_16_;
    uVar2 = vcmpss_avx512f(local_58,auVar9,2);
    bVar3 = (bool)((byte)uVar2 & 1);
    local_98._4_12_ = wo._12_12_;
    local_98._0_4_ = (uint)bVar3 * (int)-auVar25._0_4_ + (uint)!bVar3 * (int)auVar25._0_4_;
    uVar2 = vcmpss_avx512f(local_98,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),local_98);
    fVar10 = acosf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar9._0_4_));
    auVar9 = vmovshdup_avx(auVar14);
    fVar11 = atan2f(auVar9._0_4_,auVar14._0_4_);
    auVar9 = vpermilps_avx(local_88,0xe1);
    auVar22 = ZEXT856(auVar9._8_8_);
    local_70 = fVar11;
    local_6c = fVar10;
    PVar27 = PiecewiseLinear2D<2UL>::Sample(&this->brdf->luminance,(Vector2f)auVar9._0_8_,&local_70)
    ;
    auVar18._0_8_ = PVar27.p.super_Tuple2<pbrt::Vector2,_float>;
    auVar18._8_56_ = auVar22;
    local_88 = auVar18._0_16_;
    PVar28 = PiecewiseLinear2D<2UL>::Sample(&this->brdf->vndf,auVar18._0_8_,&local_70);
    auVar19._0_8_ = PVar28.p.super_Tuple2<pbrt::Vector2,_float>;
    auVar19._8_56_ = auVar22;
    local_68 = auVar19._0_16_;
    auVar9 = vmovshdup_avx(local_68);
    local_a8._0_4_ =
         PVar28.p.super_Tuple2<pbrt::Vector2,_float>.x *
         PVar28.p.super_Tuple2<pbrt::Vector2,_float>.x * 1.5707964;
    auVar9 = vfmadd132ss_fma(auVar9,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
    fVar13 = auVar9._0_4_ * 3.1415927;
    bVar3 = this->brdf->isotropic;
    local_b8 = ZEXT416((uint)(bVar3 & 1) * (int)(fVar13 + fVar11) +
                       (uint)!(bool)(bVar3 & 1) * (int)fVar13);
    fVar12 = sinf((float)local_a8._0_4_);
    fVar13 = cosf((float)local_a8._0_4_);
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar12));
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar12),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    local_a8._4_12_ = auVar9._4_12_;
    local_a8._0_4_ = (uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar9._0_4_;
    local_48 = cosf((float)local_b8._0_4_);
    uStack_44 = extraout_XMM0_Db;
    uStack_40 = extraout_XMM0_Dc;
    uStack_3c = extraout_XMM0_Dd;
    auVar20._0_4_ = sinf((float)local_b8._0_4_);
    auVar20._4_60_ = extraout_var;
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar13));
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar13),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar8._4_12_ = auVar9._4_12_;
    auVar8._0_4_ = (float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar9._0_4_);
    auVar5._4_4_ = uStack_44;
    auVar5._0_4_ = local_48;
    auVar5._8_4_ = uStack_40;
    auVar5._12_4_ = uStack_3c;
    auVar9 = vinsertps_avx(auVar5,auVar20._0_16_,0x10);
    auVar15._0_4_ = auVar9._0_4_ * (float)local_a8._0_4_;
    auVar15._4_4_ = auVar9._4_4_ * (float)local_a8._0_4_;
    auVar15._8_4_ = auVar9._8_4_ * (float)local_a8._0_4_;
    auVar15._12_4_ = auVar9._12_4_ * (float)local_a8._0_4_;
    auVar23._0_4_ = auVar14._0_4_ * auVar15._0_4_;
    auVar23._4_4_ = auVar14._4_4_ * auVar15._4_4_;
    auVar23._8_4_ = auVar14._8_4_ * auVar15._8_4_;
    auVar23._12_4_ = auVar14._12_4_ * auVar15._12_4_;
    auVar9 = vmovshdup_avx(auVar23);
    auVar9 = vfmadd231ss_fma(auVar9,auVar14,auVar15);
    auVar9 = vfmadd231ss_fma(auVar9,local_98,auVar8);
    fVar13 = auVar9._0_4_ + auVar9._0_4_;
    fVar1 = auVar8._0_4_ * fVar13 - local_98._0_4_;
    if (0.0 < fVar1) {
      lVar7 = 0;
      local_b8 = ZEXT416((uint)fVar1);
      auVar16._0_4_ = auVar15._0_4_ * fVar13;
      auVar16._4_4_ = auVar15._4_4_ * fVar13;
      auVar16._8_4_ = auVar15._8_4_ * fVar13;
      auVar16._12_4_ = auVar15._12_4_ * fVar13;
      auVar14 = vsubps_avx(auVar16,auVar14);
      _local_d8 = ZEXT816(0) << 0x20;
      local_98 = auVar9;
      do {
        local_bc = (this->lambda).lambda.values[lVar7];
        local_c4 = fVar11;
        local_c0 = fVar10;
        fVar13 = PiecewiseLinear2D<3UL>::Evaluate
                           (&this->brdf->spectra,(Vector2f)local_88._0_8_,&local_c4);
        *(float *)(local_d8 + lVar7 * 4) = fVar13;
        if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
             ::reg == '\0') &&
           (iVar6 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                         ::reg), iVar6 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                            ::StatsAccumulator__,(PixelAccumFunc)0x0);
          __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
        fVar13 = *(float *)(local_d8 + lVar7 * 4);
        *(long *)(in_FS_OFFSET + -0xa0) = *(long *)(in_FS_OFFSET + -0xa0) + 1;
        if (fVar13 < 0.0) {
          *(long *)(in_FS_OFFSET + -0xa8) = *(long *)(in_FS_OFFSET + -0xa8) + 1;
        }
        auVar9 = vmaxss_avx(ZEXT416((uint)fVar13),ZEXT416(0));
        *(int *)(local_d8 + lVar7 * 4) = auVar9._0_4_;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      fVar10 = fVar10 * 0.63661975;
      if (fVar10 < 0.0) {
        auVar21._0_4_ = sqrtf(fVar10);
        auVar21._4_60_ = extraout_var_00;
        auVar9 = auVar21._0_16_;
      }
      else {
        auVar9 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
      }
      auVar24._0_4_ = (fVar11 + 3.1415927) / 6.2831855;
      auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar9 = vinsertps_avx(auVar9,auVar24,0x10);
      fVar10 = PiecewiseLinear2D<0UL>::Evaluate(&this->brdf->ndf,(Vector2f)local_68._0_8_,&local_70)
      ;
      local_e8.super_Tuple2<pbrt::Vector2,_float> = auVar9._0_8_;
      fVar13 = PiecewiseLinear2D<0UL>::Evaluate(&this->brdf->sigma,local_e8,&local_70);
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar9 = vandps_avx512vl(local_b8,auVar4);
      fVar10 = fVar10 / (auVar9._0_4_ * fVar13 * 4.0);
      auVar9 = vmaxss_avx(SUB6416(ZEXT464(0x358637bd),0),
                          ZEXT416((uint)((float)local_68._0_4_ * 19.73921 * fVar12)));
      if (local_58._0_4_ <= 0.0) {
        auVar26._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
        auVar26._8_4_ = auVar14._8_4_ ^ 0x80000000;
        auVar26._12_4_ = auVar14._12_4_ ^ 0x80000000;
        auVar14 = auVar26;
      }
      uVar2 = vcmpss_avx512f(local_58,ZEXT816(0) << 0x40,2);
      bVar3 = (bool)((byte)uVar2 & 1);
      __return_storage_ptr__->set = true;
      *(float *)&__return_storage_ptr__->optionalValue = fVar10 * (float)local_d8._0_4_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = fVar10 * (float)local_d8._4_4_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = fVar10 * fStack_d0;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar10 * fStack_cc;
      uVar2 = vmovlps_avx(auVar14);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
      *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
           (uint)bVar3 * (local_b8._0_4_ ^ 0x80000000) + (uint)!bVar3 * local_b8._0_4_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
           (PVar28.pdf * PVar27.pdf) / (auVar9._0_4_ * (float)local_98._0_4_ * 4.0);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0x3f80000000000009;
      (__return_storage_ptr__->optionalValue).__data[0x28] = '\0';
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<BSDFSample> MeasuredBxDF::Sample_f(Vector3f wo, Float uc, Point2f u,
                                                  TransportMode mode,
                                                  BxDFReflTransFlags sampleFlags) const {
    if (!(sampleFlags & BxDFReflTransFlags::Reflection))
        return {};

    bool flipWi = false;
    if (wo.z <= 0) {
        wo = -wo;
        flipWi = true;
    }

    Float theta_i = SphericalTheta(wo), phi_i = std::atan2(wo.y, wo.x);

    Vector2f sample = Vector2f(u.y, u.x);
    Float params[2] = {phi_i, theta_i};
    auto s = brdf->luminance.Sample(sample, params);
    sample = s.p;
    Float lumPDF = s.pdf;

    s = brdf->vndf.Sample(sample, params);
    Vector2f u_wm = s.p;
    Float ndfPDF = s.pdf;

    Float phi_m = u2phi(u_wm.y), theta_m = u2theta(u_wm.x);
    if (brdf->isotropic)
        phi_m += phi_i;

    /* Spherical -> Cartesian coordinates */
    Float sinTheta_m = std::sin(theta_m), cosTheta_m = std::cos(theta_m);
    Vector3f wm = SphericalDirection(sinTheta_m, cosTheta_m, phi_m);

    Vector3f wi = Reflect(wo, wm);
    if (wi.z <= 0)
        return {};

    SampledSpectrum fr(0);
    for (int i = 0; i < pbrt::NSpectrumSamples; ++i) {
        Float params_fr[3] = {phi_i, theta_i, lambda[i]};
        fr[i] = brdf->spectra.Evaluate(sample, params_fr);
        CHECK_RARE(1e-5f, fr[i] < 0);
        fr[i] = std::max<Float>(0, fr[i]);
    }

    Vector2f u_wo = Vector2f(theta2u(theta_i), phi2u(phi_i));
    fr *= brdf->ndf.Evaluate(u_wm, params) /
          (4 * brdf->sigma.Evaluate(u_wo, params) * AbsCosTheta(wi));

    Float jacobian =
        4 * Dot(wo, wm) * std::max<Float>(2 * Sqr(Pi) * u_wm.x * sinTheta_m, 1e-6f);
    Float pdf = ndfPDF * lumPDF / jacobian;

    if (flipWi)
        wi = -wi;
    return BSDFSample(fr, wi, pdf, BxDFFlags::GlossyReflection);
}